

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O2

int is_frame_level_cost_upd_freq_set
              (AV1_COMMON *cm,INTERNAL_COST_UPDATE_TYPE cost_upd_level,int use_nonrd_pick_mode,
              int frames_since_key)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  uVar2 = 1;
  if (((cm->current_frame).frame_type & 0xfd) != 0) {
    if (use_nonrd_pick_mode == 0) {
      bVar3 = ((cm->current_frame).frame_number & 7) == 1;
    }
    else {
      bVar3 = frames_since_key < 2;
    }
    uVar2 = (uint)bVar3;
  }
  uVar1 = 1;
  if (use_nonrd_pick_mode != 0) {
    uVar1 = uVar2;
  }
  if (cost_upd_level == INTERNAL_COST_UPD_OFF) {
    uVar1 = uVar2;
  }
  if (cost_upd_level == INTERNAL_COST_UPD_TILE) {
    uVar1 = 1;
  }
  return uVar1;
}

Assistant:

static inline int is_frame_level_cost_upd_freq_set(
    const AV1_COMMON *const cm, const INTERNAL_COST_UPDATE_TYPE cost_upd_level,
    const int use_nonrd_pick_mode, const int frames_since_key) {
  const int fill_costs =
      frame_is_intra_only(cm) ||
      (use_nonrd_pick_mode ? frames_since_key < 2
                           : (cm->current_frame.frame_number & 0x07) == 1);
  return ((!use_nonrd_pick_mode && cost_upd_level != INTERNAL_COST_UPD_OFF) ||
          cost_upd_level == INTERNAL_COST_UPD_TILE || fill_costs);
}